

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O2

void test_compile_program(void)

{
  size_t *__x;
  ostream *poVar1;
  Machine local_500;
  undefined1 local_490 [8];
  Flattener f;
  Machine local_350;
  undefined1 local_2e0 [8];
  Machine m;
  FOTerm local_230;
  FOTerm local_1f0;
  FOTerm local_1b0;
  FOTerm local_170;
  FOTerm local_130;
  _Rb_tree<Register,_std::pair<const_Register,_FOTermFlattened>,_std::_Select1st<std::pair<const_Register,_FOTermFlattened>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_FOTermFlattened>_>_>
  local_f0;
  undefined1 local_c0 [8];
  FOTerm q;
  FOTerm p;
  vector<Inst,_std::allocator<Inst>_> is;
  
  test_create_query();
  test_create_program();
  std::operator<<((ostream *)&std::cout,"*** TEST_COMPILE_PROGRAM ***\n");
  m.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&m;
  m.heap._M_t._M_impl._0_4_ = 0;
  m.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  m.heap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  m.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  m.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&m.regval;
  m.regval._M_t._M_impl._0_4_ = 0;
  m.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  m.regval._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  m.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  m.regval._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  m.h.hix = 0;
  m.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       m.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  m.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       m.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  Flattener::Flattener((Flattener *)local_490);
  poVar1 = std::operator<<((ostream *)&std::cout,"*** flattened query: ");
  FOTerm::FOTerm((FOTerm *)&m.mode,(FOTerm *)local_c0);
  FOTerm::print((FOTerm *)&m.mode,poVar1);
  poVar1 = std::operator<<(poVar1," | program: ");
  FOTerm::FOTerm(&local_230,(FOTerm *)((long)&q.name.field_2 + 8));
  FOTerm::print(&local_230,poVar1);
  std::operator<<(poVar1," ***\n");
  FOTerm::~FOTerm(&local_230);
  FOTerm::~FOTerm((FOTerm *)&m.mode);
  FOTerm::FOTerm(&local_1f0,(FOTerm *)local_c0);
  flatten((Flattener *)local_490,&local_1f0);
  FOTerm::~FOTerm(&local_1f0);
  FOTerm::FOTerm(&local_1b0,(FOTerm *)((long)&q.name.field_2 + 8));
  flatten((Flattener *)local_490,&local_1b0);
  FOTerm::~FOTerm(&local_1b0);
  std::operator<<((ostream *)&std::cout,"*** flattened representation (page 15) ***\n");
  __x = &f.var2reg._M_t._M_impl.super__Rb_tree_header._M_node_count;
  printMap<Register,FOTermFlattened>
            ((ostream *)&std::cout,
             (map<Register,_FOTermFlattened,_std::less<Register>,_std::allocator<std::pair<const_Register,_FOTermFlattened>_>_>
              *)__x);
  std::
  _Rb_tree<Register,_std::pair<const_Register,_FOTermFlattened>,_std::_Select1st<std::pair<const_Register,_FOTermFlattened>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_FOTermFlattened>_>_>
  ::_Rb_tree(&local_f0,
             (_Rb_tree<Register,_std::pair<const_Register,_FOTermFlattened>,_std::_Select1st<std::pair<const_Register,_FOTermFlattened>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_FOTermFlattened>_>_>
              *)__x);
  compileQuery((vector<Inst,_std::allocator<Inst>_> *)((long)&p.name.field_2 + 8),
               (map<Register,_FOTermFlattened,_std::less<Register>,_std::allocator<std::pair<const_Register,_FOTermFlattened>_>_>
                *)&local_f0);
  std::
  _Rb_tree<Register,_std::pair<const_Register,_FOTermFlattened>,_std::_Select1st<std::pair<const_Register,_FOTermFlattened>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_FOTermFlattened>_>_>
  ::~_Rb_tree(&local_f0);
  poVar1 = std::operator<<((ostream *)&std::cout,"*** Running program ");
  FOTerm::FOTerm(&local_170,(FOTerm *)((long)&q.name.field_2 + 8));
  FOTerm::print(&local_170,poVar1);
  poVar1 = std::operator<<(poVar1,"On query ");
  FOTerm::FOTerm(&local_130,(FOTerm *)local_c0);
  FOTerm::print(&local_130,poVar1);
  std::operator<<(poVar1,"***\n");
  FOTerm::~FOTerm(&local_130);
  FOTerm::~FOTerm(&local_170);
  Machine::Machine((Machine *)&f.flat._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (Machine *)local_2e0);
  std::vector<Inst,_std::allocator<Inst>_>::vector
            ((vector<Inst,_std::allocator<Inst>_> *)
             &is.super__Vector_base<Inst,_std::allocator<Inst>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(vector<Inst,_std::allocator<Inst>_> *)((long)&p.name.field_2 + 8));
  runInsts(&local_500,(Machine *)&f.flat._M_t._M_impl.super__Rb_tree_header._M_node_count,
           (vector<Inst,_std::allocator<Inst>_> *)
           &is.super__Vector_base<Inst,_std::allocator<Inst>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage);
  Machine::operator=((Machine *)local_2e0,&local_500);
  Machine::~Machine(&local_500);
  std::vector<Inst,_std::allocator<Inst>_>::~vector
            ((vector<Inst,_std::allocator<Inst>_> *)
             &is.super__Vector_base<Inst,_std::allocator<Inst>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  Machine::~Machine((Machine *)&f.flat._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::operator<<((ostream *)&std::cout,"*** final state:**\n");
  Machine::Machine(&local_350,(Machine *)local_2e0);
  prettyPrintMachine(&local_350);
  Machine::~Machine(&local_350);
  std::vector<Inst,_std::allocator<Inst>_>::~vector
            ((vector<Inst,_std::allocator<Inst>_> *)((long)&p.name.field_2 + 8));
  Flattener::~Flattener((Flattener *)local_490);
  Machine::~Machine((Machine *)local_2e0);
  FOTerm::~FOTerm((FOTerm *)((long)&q.name.field_2 + 8));
  FOTerm::~FOTerm((FOTerm *)local_c0);
  return;
}

Assistant:

void test_compile_program() {
    const FOTerm q = test_create_query();
    const FOTerm p = test_create_program();
    std::cout << "*** TEST_COMPILE_PROGRAM ***\n";

    Machine m;
    Flattener f;

    {

        // std::cout << "*** Machine state after compiling query: " << q
        //           << " ***\n";
        // prettyPrintMachine(m);
    }

    std::cout << "*** flattened query: " << q << " | program: " << p << " ***\n";
    (void)flatten(f, q);
    (void)flatten(f, p);

    std::cout << "*** flattened representation (page 15) ***\n";
    printMap(std::cout, f.flat);

    std::vector<Inst> is = compileQuery(f.flat);
    std::cout << "*** Running program " << p << "On query " << q << "***\n";
    m = runInsts(m, is);

    std::cout << "*** final state:**\n";
    prettyPrintMachine(m);
        // runInstsPrettyPrint(std::cout, m, is);

}